

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O2

int create_iso_image(uchar *buff,size_t buffsize,size_t *used,char *opt)

{
  int iVar1;
  archive *_a;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char sym1 [2];
  int local_3d4;
  char fname2 [256];
  char sym128 [129];
  char fname1 [256];
  char sym255 [256];
  
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Û',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_iso9660(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ü',(uint)(iVar1 == 0),"0 == archive_write_set_format_iso9660(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ý',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_set_option(_a,(char *)0x0,"pad",(char *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Þ',(uint)(iVar1 == 0),"0 == archive_write_set_option(a, NULL, \"pad\", NULL)"
                   ,_a);
  if (used != (size_t *)0x0) {
    iVar1 = archive_write_set_options(_a,(char *)used);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'à',(uint)(iVar1 == 0),"0 == archive_write_set_options(a, opt)",_a);
  }
  iVar1 = archive_write_set_bytes_per_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'á',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",_a);
  iVar1 = archive_write_set_bytes_in_last_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'â',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",_a);
  iVar1 = archive_write_open_memory(_a,buff,0x3c000,(size_t *)buffsize);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'ã',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, used)",_a);
  sym1[0] = 'x';
  sym1[1] = '\0';
  for (lVar2 = 0; lVar2 != 0x7f; lVar2 = lVar2 + 1) {
    sym128[lVar2] = 'a';
  }
  sym128[0x7f] = 'x';
  sym128[0x80] = '\0';
  for (lVar2 = 0; lVar2 != 0xfe; lVar2 = lVar2 + 1) {
    sym255[lVar2] = 'a';
  }
  sym255[0xfe] = 'x';
  sym255[0xff] = '\0';
  uVar4 = 0;
  local_3d4 = 0;
  do {
    if (uVar4 == 0x20) {
      iVar1 = archive_write_close(_a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'ī',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",_a);
      iVar1 = archive_write_free(_a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",_a);
      return local_3d4;
    }
    uVar5 = (ulong)(uint)(&DAT_00250780)[uVar4];
    if ((int)(&DAT_00250780)[uVar4] < 1) {
      uVar5 = 0;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      fname1[uVar3] = 'a';
      fname2[uVar3] = 'A';
    }
    if (uVar4 == 0) {
LAB_001c2837:
      (fname1 + uVar5)[0] = '.';
      (fname1 + uVar5)[1] = 'c';
      fname1[uVar5 + 2] = '\0';
      (fname2 + uVar5)[0] = '.';
      (fname2 + uVar5)[1] = 'C';
      fname2[uVar5 + 2] = '\0';
      add_entry(_a,fname1,sym128);
      add_entry(_a,fname2,sym255);
      if ((uVar4 & 0x7ffffffffffffffc) == 0x1c) {
        local_3d4 = local_3d4 + 2;
      }
      else {
        builtin_strncpy(fname1 + uVar5,".png",5);
        builtin_strncpy(fname2 + uVar5,".PNG",5);
        add_entry(_a,fname1,(char *)0x0);
        add_entry(_a,fname2,sym1);
        builtin_strncpy(fname1 + uVar5,".jpeg",6);
        builtin_strncpy(fname2 + uVar5,".JPEG",6);
        add_entry(_a,fname1,sym128);
        add_entry(_a,fname2,sym255);
        local_3d4 = local_3d4 + 6;
      }
    }
    else {
      fname1[uVar5] = '\0';
      fname2[uVar5] = '\0';
      add_entry(_a,fname1,(char *)0x0);
      add_entry(_a,fname2,sym1);
      local_3d4 = local_3d4 + 2;
      if (uVar4 - 0x20 < 0xfffffffffffffffe) goto LAB_001c2837;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int
create_iso_image(unsigned char *buff, size_t buffsize, size_t *used,
    const char *opt)
{
	struct archive *a;
	int i, l, fcnt;
	const int lens[] = {
	    0, 1, 3, 5, 7, 8, 9, 29, 30, 31, 32,
		62, 63, 64, 65, 101, 102, 103, 104,
	    191, 192, 193, 194, 204, 205, 206, 207, 208,
		252, 253, 254, 255,
	    -1 };
	char fname1[256];
	char fname2[256];
	char sym1[2];
	char sym128[129];
	char sym255[256];

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_iso9660(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_option(a, NULL, "pad", NULL));
	if (opt)
		assertA(0 == archive_write_set_options(a, opt));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, used));

	sym1[0] = 'x';
	sym1[1] = '\0';
	for (i = 0; i < (int)sizeof(sym128)-2; i++)
		sym128[i] = 'a';
	sym128[sizeof(sym128)-2] = 'x';
	sym128[sizeof(sym128)-1] = '\0';
	for (i = 0; i < (int)sizeof(sym255)-2; i++)
		sym255[i] = 'a';
	sym255[sizeof(sym255)-2] = 'x';
	sym255[sizeof(sym255)-1] = '\0';

	fcnt = 0;
	for (i = 0; lens[i] >= 0; i++) {
		for (l = 0; l < lens[i]; l++) {
			fname1[l] = 'a';
			fname2[l] = 'A';
		}
		if (l > 0) {
			fname1[l] = '\0';
			fname2[l] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 254) {
			fname1[l] = '.';
			fname1[l+1] = 'c';
			fname1[l+2] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'C';
			fname2[l+2] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
		if (l < 252) {
			fname1[l] = '.';
			fname1[l+1] = 'p';
			fname1[l+2] = 'n';
			fname1[l+3] = 'g';
			fname1[l+4] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'P';
			fname2[l+2] = 'N';
			fname2[l+3] = 'G';
			fname2[l+4] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 251) {
			fname1[l] = '.';
			fname1[l+1] = 'j';
			fname1[l+2] = 'p';
			fname1[l+3] = 'e';
			fname1[l+4] = 'g';
			fname1[l+5] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'J';
			fname2[l+2] = 'P';
			fname2[l+3] = 'E';
			fname2[l+4] = 'G';
			fname2[l+5] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
	}

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	return (fcnt);
}